

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O2

bool __thiscall raft_functional_common::TestSm::apply_snapshot(TestSm *this,snapshot *s)

{
  ptr<buffer> snp_buf;
  buffer *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::mutex::lock(&this->lastSnapshotLock);
  nuraft::snapshot::serialize((snapshot *)&local_38);
  nuraft::snapshot::deserialize((snapshot *)&stack0xffffffffffffffd8,local_38);
  std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->lastSnapshot).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  pthread_mutex_unlock((pthread_mutex_t *)&this->lastSnapshotLock);
  return true;
}

Assistant:

bool apply_snapshot(snapshot& s) {
        std::lock_guard<std::mutex> ll(lastSnapshotLock);
        // NOTE: We only handle logical snapshot.
        ptr<buffer> snp_buf = s.serialize();
        lastSnapshot = snapshot::deserialize(*snp_buf);
        return true;
    }